

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::LRNParameter::InternalSerializeWithCachedSizesToArray
          (LRNParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  uint8 *puVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 4) != 0) {
    uVar8 = this->local_size_;
    *target = '\b';
    pbVar7 = target + 1;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar4);
    }
    *pbVar7 = (byte)uVar9;
    target = pbVar7 + 1;
  }
  if ((uVar2 & 8) != 0) {
    fVar1 = this->alpha_;
    *target = 0x15;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 0x10) != 0) {
    fVar1 = this->beta_;
    *target = 0x1d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 1) != 0) {
    uVar10 = (ulong)this->norm_region_;
    pbVar7 = target + 1;
    *target = 0x20;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar7 = (byte)uVar6 | 0x80;
        uVar10 = uVar6 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar4 = 0x3fff < uVar6;
        uVar6 = uVar10;
      } while (bVar4);
    }
    *pbVar7 = (byte)uVar10;
    target = pbVar7 + 1;
  }
  if ((uVar2 & 0x20) != 0) {
    fVar1 = this->k_;
    *target = 0x2d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar2 & 2) != 0) {
    uVar6 = (ulong)this->engine_;
    pbVar7 = target + 1;
    *target = 0x30;
    uVar10 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar7 = (byte)uVar6 | 0x80;
        uVar10 = uVar6 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar4 = 0x3fff < uVar6;
        uVar6 = uVar10;
      } while (bVar4);
    }
    *pbVar7 = (byte)uVar10;
    target = pbVar7 + 1;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* LRNParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.LRNParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 local_size = 1 [default = 5];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->local_size(), target);
  }

  // optional float alpha = 2 [default = 1];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->alpha(), target);
  }

  // optional float beta = 3 [default = 0.75];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->beta(), target);
  }

  // optional .caffe.LRNParameter.NormRegion norm_region = 4 [default = ACROSS_CHANNELS];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->norm_region(), target);
  }

  // optional float k = 5 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(5, this->k(), target);
  }

  // optional .caffe.LRNParameter.Engine engine = 6 [default = DEFAULT];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      6, this->engine(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.LRNParameter)
  return target;
}